

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ILBDOperator.cpp
# Opt level: O1

double __thiscall lts2::LBDOperator::measureAtCell(LBDOperator *this,int cellIndex)

{
  IntegratingCell *pIVar1;
  long lVar2;
  long lVar3;
  
  pIVar1 = this->_sensitiveCells;
  lVar2 = (long)pIVar1[cellIndex].ymin * **(long **)&this->field_0x60 + *(long *)&this->field_0x28;
  lVar3 = (long)pIVar1[cellIndex].ymax * **(long **)&this->field_0x60 + *(long *)&this->field_0x28;
  return (((*(double *)(lVar2 + (long)pIVar1[cellIndex].xmin * 8) +
           *(double *)(lVar3 + (long)pIVar1[cellIndex].xmax * 8)) -
          *(double *)(lVar2 + (long)pIVar1[cellIndex].xmax * 8)) -
         *(double *)(lVar3 + (long)pIVar1[cellIndex].xmin * 8)) * pIVar1[cellIndex].scaleFactor;
}

Assistant:

double lts2::LBDOperator::measureAtCell(int cellIndex) const
{
    double measure = 0.0;
    
    lbd::IntegratingCell cell = _sensitiveCells[cellIndex];

    double A, B, C, D;
    
    A = *(_integralImage.ptr<double>(cell.ymin) + cell.xmin);
    B = *(_integralImage.ptr<double>(cell.ymin) + cell.xmax);
    C = *(_integralImage.ptr<double>(cell.ymax) + cell.xmin);
    D = *(_integralImage.ptr<double>(cell.ymax) + cell.xmax);
    
    measure = cell.scaleFactor * (D + A - B - C);
    
    return measure;
}